

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void helpEnv(TidyDoc tdoc)

{
  char *pcVar1;
  ctmbstr ptVar2;
  tmbstr __ptr;
  char *local_38;
  char *local_30;
  ctmbstr env_var;
  Bool uses_env;
  tmbstr subst;
  TidyDoc tdoc_local;
  
  pcVar1 = getenv("HTML_TIDY");
  if (pcVar1 != (char *)0x0) {
    local_30 = getenv("HTML_TIDY");
  }
  else {
    local_30 = tidyLocalizedString(0x35e);
  }
  ptVar2 = tidyLocalizedString(0x35d);
  __ptr = stringWithFormat(ptVar2,"/etc/tidy.conf","~/.tidyrc");
  if (local_30 == (char *)0x0) {
    local_38 = tidyLocalizedString(0x35e);
  }
  else {
    local_38 = local_30;
  }
  printf(anon_var_dwarf_13102 + 0x15d);
  ptVar2 = tidyLocalizedString(0x35c);
  printf(ptVar2,__ptr,local_38);
  if (pcVar1 != (char *)0x0) {
    ptVar2 = tidyLocalizedString(0x35f);
    printf(ptVar2,"~/.tidyrc");
  }
  free(__ptr);
  printf(anon_var_dwarf_13102 + 0x15d);
  return;
}

Assistant:

static void helpEnv( TidyDoc tdoc )
{
    tmbstr subst = "";
    Bool uses_env = getenv("HTML_TIDY") != NULL;
    ctmbstr env_var = uses_env ? getenv("HTML_TIDY"): tidyLocalizedString( TC_TXT_HELP_ENV_1B );

#if defined( TIDY_CONFIG_FILE ) && defined( TIDY_USER_CONFIG_FILE )
    subst = stringWithFormat( tidyLocalizedString(TC_TXT_HELP_ENV_1A), TIDY_CONFIG_FILE, TIDY_USER_CONFIG_FILE );
#endif

    env_var = env_var != NULL ? env_var : tidyLocalizedString( TC_TXT_HELP_ENV_1B );

    printf( "\n" );
    printf( tidyLocalizedString( TC_TXT_HELP_ENV_1), subst, env_var );

#if defined( TIDY_CONFIG_FILE ) && defined( TIDY_USER_CONFIG_FILE )
    if ( uses_env )
        printf( tidyLocalizedString( TC_TXT_HELP_ENV_1C ), TIDY_USER_CONFIG_FILE );
    free( subst );
#endif

    printf( "\n" );
}